

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_LZWDecoder.cc
# Opt level: O2

uchar __thiscall Pl_LZWDecoder::getFirstChar(Pl_LZWDecoder *this,uint code)

{
  reference this_00;
  byte *pbVar1;
  runtime_error *prVar2;
  string sStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (0xff < code) {
    if (code < 0x102) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&sStack_78,code);
      std::operator+(&local_58,"Pl_LZWDecoder::getFirstChar called with invalid code (",&sStack_78);
      std::operator+(&local_38,&local_58,")");
      std::runtime_error::runtime_error(prVar2,(string *)&local_38);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((ulong)((long)(this->table).super__Vector_base<Buffer,_std::allocator<Buffer>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->table).super__Vector_base<Buffer,_std::allocator<Buffer>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= (ulong)(code - 0x102)) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"Pl_LZWDecoder::getFirstChar: table overflow");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_00 = std::vector<Buffer,_std::allocator<Buffer>_>::at(&this->table,(ulong)(code - 0x102));
    pbVar1 = Buffer::getBuffer(this_00);
    code = (uint)*pbVar1;
  }
  return (uchar)code;
}

Assistant:

unsigned char
Pl_LZWDecoder::getFirstChar(unsigned int code)
{
    unsigned char result = '\0';
    if (code < 256) {
        result = static_cast<unsigned char>(code);
    } else if (code > 257) {
        unsigned int idx = code - 258;
        if (idx >= table.size()) {
            throw std::runtime_error("Pl_LZWDecoder::getFirstChar: table overflow");
        }
        Buffer& b = table.at(idx);
        result = b.getBuffer()[0];
    } else {
        throw std::runtime_error(
            "Pl_LZWDecoder::getFirstChar called with invalid code (" + std::to_string(code) + ")");
    }
    return result;
}